

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.cpp
# Opt level: O0

WalletDescriptor *
wallet::GenerateWalletDescriptor(CExtPubKey *master_key,OutputType *addr_type,bool internal)

{
  bool bVar1;
  WalletDescriptor *this;
  CChainParams *__a;
  byte in_CL;
  uint *in_RDX;
  FlatSigningProvider *in_RDI;
  long in_FS_OFFSET;
  int64_t creation_time;
  WalletDescriptor *w_desc;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  desc;
  string error;
  FlatSigningProvider keys;
  string desc_str;
  string internal_path;
  string desc_suffix;
  string desc_prefix;
  string xpub;
  CChainParams *in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  char *__rhs;
  int32_t next_index;
  int32_t in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  int32_t range_start;
  CExtPubKey *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  FlatSigningProvider *this_01;
  allocator<char> local_302;
  allocator<char> local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  local_2e0 [22];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  GetTime();
  EncodeExtPubKey_abi_cxx11_(in_stack_fffffffffffffc68);
  std::__cxx11::string::string(in_stack_fffffffffffffc40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70,
             (allocator<char> *)in_stack_fffffffffffffc68);
  std::allocator<char>::~allocator(&local_301);
  this = (WalletDescriptor *)(ulong)*in_RDX;
  switch(this) {
  case (WalletDescriptor *)0x0:
    std::operator+((char *)this,in_stack_fffffffffffffc70);
    std::operator+(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    break;
  case (WalletDescriptor *)0x1:
    std::operator+((char *)this,in_stack_fffffffffffffc70);
    std::operator+(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    in_stack_fffffffffffffc70 = local_c8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    break;
  case (WalletDescriptor *)0x2:
    std::operator+((char *)this,in_stack_fffffffffffffc70);
    std::operator+(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    break;
  case (WalletDescriptor *)0x3:
    std::operator+((char *)this,in_stack_fffffffffffffc70);
    std::operator+(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    break;
  case (WalletDescriptor *)0x4:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletutil.cpp"
                  ,0x4f,
                  "WalletDescriptor wallet::GenerateWalletDescriptor(const CExtPubKey &, const OutputType &, bool)"
                 );
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!desc_prefix.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletutil.cpp"
                  ,0x52,
                  "WalletDescriptor wallet::GenerateWalletDescriptor(const CExtPubKey &, const OutputType &, bool)"
                 );
  }
  __a = Params();
  bVar1 = CChainParams::IsTestChain(in_stack_fffffffffffffc28);
  range_start = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc64);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  }
  if ((in_CL & 1) == 0) {
    __rhs = "/0";
  }
  else {
    __rhs = "/1";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)in_stack_fffffffffffffc70,(allocator<char> *)__a);
  std::allocator<char>::~allocator(&local_302);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(range_start,in_stack_fffffffffffffc60),__rhs);
  next_index = (int32_t)((ulong)__rhs >> 0x20);
  std::operator+(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::operator+(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc28);
  this_00 = local_2e0;
  FlatSigningProvider::FlatSigningProvider((FlatSigningProvider *)in_stack_fffffffffffffc28);
  std::__cxx11::string::string(&local_300);
  Parse((string *)this_01,in_RDI,(string *)this,SUB81((ulong)in_stack_fffffffffffffc70 >> 0x38,0));
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::at(this_00,(size_type)in_stack_fffffffffffffc30);
  std::shared_ptr<Descriptor>::shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
            ((shared_ptr<Descriptor> *)in_stack_fffffffffffffc28,
             (unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)0xb99544);
  WalletDescriptor::WalletDescriptor
            (this,(shared_ptr<Descriptor> *)in_stack_fffffffffffffc70,(uint64_t)__a,range_start,
             in_stack_fffffffffffffc60,next_index);
  std::shared_ptr<Descriptor>::~shared_ptr((shared_ptr<Descriptor> *)in_stack_fffffffffffffc28);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector(this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc28);
  FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)in_stack_fffffffffffffc28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (WalletDescriptor *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

WalletDescriptor GenerateWalletDescriptor(const CExtPubKey& master_key, const OutputType& addr_type, bool internal)
{
    int64_t creation_time = GetTime();

    std::string xpub = EncodeExtPubKey(master_key);

    // Build descriptor string
    std::string desc_prefix;
    std::string desc_suffix = "/*)";
    switch (addr_type) {
    case OutputType::LEGACY: {
        desc_prefix = "pkh(" + xpub + "/44h";
        break;
    }
    case OutputType::P2SH_SEGWIT: {
        desc_prefix = "sh(wpkh(" + xpub + "/49h";
        desc_suffix += ")";
        break;
    }
    case OutputType::BECH32: {
        desc_prefix = "wpkh(" + xpub + "/84h";
        break;
    }
    case OutputType::BECH32M: {
        desc_prefix = "tr(" + xpub + "/86h";
        break;
    }
    case OutputType::UNKNOWN: {
        // We should never have a DescriptorScriptPubKeyMan for an UNKNOWN OutputType,
        // so if we get to this point something is wrong
        assert(false);
    }
    } // no default case, so the compiler can warn about missing cases
    assert(!desc_prefix.empty());

    // Mainnet derives at 0', testnet and regtest derive at 1'
    if (Params().IsTestChain()) {
        desc_prefix += "/1h";
    } else {
        desc_prefix += "/0h";
    }

    std::string internal_path = internal ? "/1" : "/0";
    std::string desc_str = desc_prefix + "/0h" + internal_path + desc_suffix;

    // Make the descriptor
    FlatSigningProvider keys;
    std::string error;
    std::vector<std::unique_ptr<Descriptor>> desc = Parse(desc_str, keys, error, false);
    WalletDescriptor w_desc(std::move(desc.at(0)), creation_time, 0, 0, 0);
    return w_desc;
}